

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

void cleanup_opt_struct(void)

{
  free(role_spec.choices);
  role_spec.choices = (nh_listitem *)0x0;
  free(race_spec.choices);
  race_spec.choices = (nh_listitem *)0x0;
  free_optlist(options);
  options = (nh_option_desc *)0x0;
  free_optlist(birth_options);
  birth_options = (nh_option_desc *)0x0;
  return;
}

Assistant:

void cleanup_opt_struct(void)
{
	free((void*)role_spec.choices);
	role_spec.choices = NULL;
	free((void*)race_spec.choices);
	race_spec.choices = NULL;
	free_optlist(options);
	options = NULL;
	free_optlist(birth_options);
	birth_options = NULL;
}